

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

int run_test_fork_signal_to_child(void)

{
  int iVar1;
  __pid_t __pid;
  undefined8 uVar2;
  ssize_t sVar3;
  uv_loop_t *loop;
  char *pcVar4;
  char sync_buf [1];
  int sync_pipe [2];
  uv_signal_t signal_handle;
  
  fork_signal_cb_called = 0;
  iVar1 = pipe(sync_pipe);
  if (iVar1 == 0) {
    run_timer_loop_once();
    uVar2 = uv_default_loop();
    iVar1 = uv_signal_init(uVar2,&signal_handle);
    if (iVar1 == 0) {
      iVar1 = uv_signal_start(&signal_handle,fork_signal_to_child_cb,10);
      if (iVar1 == 0) {
        __pid = fork();
        if (__pid == 0) {
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_fork(uVar2);
          if (iVar1 != 0) {
            pcVar4 = "0 == uv_loop_fork(uv_default_loop())";
            uVar2 = 0x107;
            goto LAB_0011870e;
          }
          sVar3 = write(sync_pipe[1],"1",1);
          if (sVar3 != 1) {
            pcVar4 = "1 == write(sync_pipe[1], \"1\", 1)";
            uVar2 = 0x108;
            goto LAB_0011870e;
          }
          uVar2 = uv_default_loop();
          iVar1 = uv_loop_alive(uVar2);
          if (iVar1 == 0) {
            pcVar4 = "0 != uv_loop_alive(uv_default_loop())";
            uVar2 = 0x10a;
            goto LAB_0011870e;
          }
          puts("Running loop in child");
          uVar2 = uv_default_loop();
          iVar1 = uv_run(uVar2,1);
          if (iVar1 != 0) {
            pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_ONCE)";
            uVar2 = 0x10c;
            goto LAB_0011870e;
          }
          if (fork_signal_cb_called != 10) {
            pcVar4 = "SIGUSR1 == fork_signal_cb_called";
            uVar2 = 0x10d;
            goto LAB_0011870e;
          }
        }
        else {
          if (__pid == -1) {
            pcVar4 = "child_pid != -1";
            uVar2 = 0xf8;
            goto LAB_0011870e;
          }
          sVar3 = read(sync_pipe[0],sync_buf,1);
          if (sVar3 != 1) {
            pcVar4 = "1 == read(sync_pipe[0], sync_buf, 1)";
            uVar2 = 0xfc;
            goto LAB_0011870e;
          }
          iVar1 = kill(__pid,10);
          if (iVar1 != 0) {
            pcVar4 = "0 == kill(child_pid, SIGUSR1)";
            uVar2 = 0xfd;
            goto LAB_0011870e;
          }
          puts("Running loop in parent");
          uv_unref(&signal_handle);
          uVar2 = uv_default_loop();
          iVar1 = uv_run(uVar2,2);
          if (iVar1 != 0) {
            pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT)";
            uVar2 = 0x101;
            goto LAB_0011870e;
          }
          if (fork_signal_cb_called != 0) {
            pcVar4 = "0 == fork_signal_cb_called";
            uVar2 = 0x102;
            goto LAB_0011870e;
          }
          puts("Waiting for child in parent");
          assert_wait_child(__pid);
        }
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar4 = "0 == uv_loop_close(uv_default_loop())";
        uVar2 = 0x110;
      }
      else {
        pcVar4 = "0 == uv_signal_start(&signal_handle, fork_signal_to_child_cb, SIGUSR1)";
        uVar2 = 0xf5;
      }
    }
    else {
      pcVar4 = "0 == uv_signal_init(uv_default_loop(), &signal_handle)";
      uVar2 = 0xf4;
    }
  }
  else {
    pcVar4 = "0 == pipe(sync_pipe)";
    uVar2 = 0xef;
  }
LAB_0011870e:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fork_signal_to_child) {
  /* A signal handler installed before forking
     is run only in the child when the child is signalled. */
  uv_signal_t signal_handle;
  pid_t child_pid;
  int sync_pipe[2];
  char sync_buf[1];

  fork_signal_cb_called = 0;    /* reset */

  ASSERT(0 == pipe(sync_pipe));

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == uv_signal_init(uv_default_loop(), &signal_handle));
  ASSERT(0 == uv_signal_start(&signal_handle, fork_signal_to_child_cb, SIGUSR1));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(1 == read(sync_pipe[0], sync_buf, 1)); /* wait for child */
    ASSERT(0 == kill(child_pid, SIGUSR1));
    /* Run the loop, make sure we don't get the signal. */
    printf("Running loop in parent\n");
    uv_unref((uv_handle_t*)&signal_handle);
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));
    ASSERT(0 == fork_signal_cb_called);
    printf("Waiting for child in parent\n");
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(1 == write(sync_pipe[1], "1", 1)); /* alert parent */
    /* Get the signal. */
    ASSERT(0 != uv_loop_alive(uv_default_loop()));
    printf("Running loop in child\n");
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
    ASSERT(SIGUSR1 == fork_signal_cb_called);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}